

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O2

BOOL Js::CrossSite::NeedMarshalVar(Var instance,ScriptContext *requestContext)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  RecyclableObject *obj;
  DynamicObject *pDVar4;
  uint uVar5;
  
  bVar1 = TaggedNumber::Is(instance);
  uVar5 = 0;
  if (!bVar1) {
    obj = UnsafeVarTo<Js::RecyclableObject>(instance);
    if ((((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
        ptr != requestContext) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,MarshalPhase);
      if (bVar1) {
        Output::Print(L"NeedMarshalVar: %p (var sc: %p, request sc: %p)\n",instance,
                      (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                      scriptContext.ptr,requestContext);
      }
      bVar1 = DynamicType::Is(((obj->type).ptr)->typeId);
      if (bVar1) {
        pDVar4 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
        iVar2 = (*(pDVar4->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(pDVar4);
        uVar5 = 0;
        if (iVar2 == 0) {
          BVar3 = RecyclableObject::IsExternal(obj);
          uVar5 = (uint)(BVar3 == 0);
        }
      }
      else {
        uVar5 = 1;
      }
    }
  }
  return uVar5;
}

Assistant:

BOOL CrossSite::NeedMarshalVar(Var instance, ScriptContext * requestContext)
    {
        if (TaggedNumber::Is(instance))
        {
            return FALSE;
        }
        RecyclableObject * object = UnsafeVarTo<RecyclableObject>(instance);
        if (object->GetScriptContext() == requestContext)
        {
            return FALSE;
        }
        if (PHASE_TRACE1(Js::Phase::MarshalPhase))
        {
            Output::Print(_u("NeedMarshalVar: %p (var sc: %p, request sc: %p)\n"), instance, object->GetScriptContext(), requestContext);
        }
        if (DynamicType::Is(object->GetTypeId()))
        {
            return !UnsafeVarTo<DynamicObject>(object)->IsCrossSiteObject() && !object->IsExternal();
        }
        return TRUE;
    }